

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O0

int erkStep_SetButcherTable(ARKodeMem ark_mem)

{
  void *pvVar1;
  ARKodeButcherTable pAVar2;
  ARKodeMem in_RDI;
  sunindextype Blrw;
  sunindextype Bliw;
  ARKodeERKStepMem step_mem;
  int etable;
  int local_28;
  ARKODE_ERKTableID in_stack_ffffffffffffffdc;
  int local_4;
  
  if (in_RDI->step_mem == (void *)0x0) {
    arkProcessError(in_RDI,-0x15,"ARKode::ERKStep","erkStep_SetButcherTable",
                    "Time step module memory is NULL.");
    local_4 = -0x15;
  }
  else {
    pvVar1 = in_RDI->step_mem;
    if (*(long *)((long)pvVar1 + 0x20) == 0) {
      switch(*(undefined4 *)((long)pvVar1 + 0x10)) {
      case 2:
        break;
      case 3:
        break;
      case 4:
        break;
      case 5:
        break;
      case 6:
        break;
      case 7:
      case 8:
        break;
      default:
        arkProcessError(in_RDI,-0x16,"ARKode::ERKStep","erkStep_SetButcherTable",
                        "No explicit method at requested order, using q=6.");
      }
      pAVar2 = ARKodeButcherTable_LoadERK(in_stack_ffffffffffffffdc);
      *(ARKodeButcherTable *)((long)pvVar1 + 0x20) = pAVar2;
      ARKodeButcherTable_Space
                (*(ARKodeButcherTable *)((long)pvVar1 + 0x20),
                 (sunindextype *)&stack0xffffffffffffffdc,&local_28);
      in_RDI->liw = (long)in_stack_ffffffffffffffdc + in_RDI->liw;
      in_RDI->lrw = (long)local_28 + in_RDI->lrw;
      if (*(long *)((long)pvVar1 + 0x20) != 0) {
        *(undefined4 *)((long)pvVar1 + 0x18) = *(undefined4 *)(*(long *)((long)pvVar1 + 0x20) + 8);
        *(undefined4 *)((long)pvVar1 + 0x10) = **(undefined4 **)((long)pvVar1 + 0x20);
        *(undefined4 *)((long)pvVar1 + 0x14) = *(undefined4 *)(*(long *)((long)pvVar1 + 0x20) + 4);
      }
      local_4 = 0;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int erkStep_SetButcherTable(ARKodeMem ark_mem)
{
  int etable;
  ARKodeERKStepMem step_mem;
  sunindextype Bliw, Blrw;

  /* access ARKodeERKStepMem structure */
  if (ark_mem->step_mem==NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ERKStep",
                    "erkStep_SetButcherTable", MSG_ERKSTEP_NO_MEM);
    return(ARK_MEM_NULL);
  }
  step_mem = (ARKodeERKStepMem) ark_mem->step_mem;

  /* if table has already been specified, just return */
  if (step_mem->B != NULL)
    return(ARK_SUCCESS);

  /* initialize table number to illegal values */
  etable = -1;

  /* select method based on order */
  switch (step_mem->q) {
  case(2):
    etable = ERKSTEP_DEFAULT_2;
    break;
  case(3):
    etable = ERKSTEP_DEFAULT_3;
    break;
  case(4):
    etable = ERKSTEP_DEFAULT_4;
    break;
  case(5):
    etable = ERKSTEP_DEFAULT_5;
    break;
  case(6):
    etable = ERKSTEP_DEFAULT_6;
    break;
  case(7):
  case(8):
    etable = ERKSTEP_DEFAULT_8;
    break;
  default:    /* no available method, set default */
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ERKStep",
                    "erkStep_SetButcherTable",
                    "No explicit method at requested order, using q=6.");
    etable = ERKSTEP_DEFAULT_6;
    break;
  }

  if (etable > -1)
    step_mem->B = ARKodeButcherTable_LoadERK(etable);

  /* note Butcher table space requirements */
  ARKodeButcherTable_Space(step_mem->B, &Bliw, &Blrw);
  ark_mem->liw += Bliw;
  ark_mem->lrw += Blrw;

  /* set [redundant] stored values for stage numbers and method orders */
  if (step_mem->B != NULL) {
    step_mem->stages = step_mem->B->stages;
    step_mem->q = step_mem->B->q;
    step_mem->p = step_mem->B->p;
  }

  return(ARK_SUCCESS);
}